

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O3

QString * defaultTemplateName(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QArrayData *local_88;
  QString local_68;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>,_QLatin1String>
  local_48;
  QString *local_10;
  
  local_10 = *(QString **)(in_FS_OFFSET + 0x28);
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  QCoreApplication::applicationName();
  local_68.d.d = local_48.a.a.a.d.d;
  local_68.d.ptr = local_48.a.a.a.d.ptr;
  local_68.d.size = local_48.a.a.a.d.size;
  if (local_48.a.a.a.d.size == 0) {
    other.m_data = "qt_temp";
    other.m_size = 7;
    QString::operator=(&local_68,other);
  }
  QDir::tempPath();
  local_48.a.a.a.d.d = (Data *)local_88;
  local_48.a.a.b = L'/';
  local_48.a.b = &local_68;
  local_48.b.m_size = 7;
  local_48.b.m_data = "-XXXXXX";
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>,_QLatin1String>::
  convertTo<QString>(in_RDI,&local_48);
  if (&(local_48.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QString defaultTemplateName()
{
    QString baseName;
#if defined(QT_BUILD_CORE_LIB)
    baseName = QCoreApplication::applicationName();
    if (baseName.isEmpty())
#endif
        baseName = "qt_temp"_L1;

    return QDir::tempPath() + u'/' + baseName + "-XXXXXX"_L1;
}